

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_default_catalog.cpp
# Opt level: O0

void ConcurrentDefaultCatalog::ScanDefaultCatalog(DuckDB *db,bool *read_correct)

{
  undefined1 *in_RSI;
  DuckDB *in_RDI;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  idx_t i;
  Connection con;
  undefined7 in_stack_ffffffffffffff70;
  byte in_stack_ffffffffffffff77;
  allocator local_61;
  string local_60 [32];
  string local_40 [8];
  ulong local_38;
  Connection local_30 [32];
  undefined1 *local_10;
  
  local_10 = in_RSI;
  duckdb::Connection::Connection(local_30,in_RDI);
  *local_10 = 1;
  for (local_38 = 0; local_38 < 10; local_38 = local_38 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"SELECT * FROM pg_class",&local_61);
    duckdb::Connection::Query(local_40);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    in_stack_ffffffffffffff77 = duckdb::BaseQueryResult::HasError();
    if ((in_stack_ffffffffffffff77 & 1) != 0) {
      *local_10 = 0;
    }
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x791eba);
  }
  duckdb::Connection::~Connection(local_30);
  return;
}

Assistant:

static void ScanDefaultCatalog(DuckDB *db, bool *read_correct) {
		Connection con(*db);
		*read_correct = true;
		for (idx_t i = 0; i < CONCURRENT_DEFAULT_ITERATION_COUNT; i++) {
			auto result = con.Query("SELECT * FROM pg_class");
			if (result->HasError()) {
				*read_correct = false;
			}
		}
	}